

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void sendBtnsState(fnode_service_t *service,string *btnsState)

{
  int iVar1;
  ulong uVar2;
  long in_RDI;
  uint32_t in_stack_00000404;
  char *in_stack_00000408;
  fnode_service_t *in_stack_00000410;
  
  if (sendBtnsState(fnode_service*,std::__cxx11::string_const&)::packet_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&sendBtnsState(fnode_service*,std::__cxx11::string_const&)::
                                 packet_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::string::string
                ((string *)
                 &sendBtnsState(fnode_service*,std::__cxx11::string_const&)::packet_abi_cxx11_);
      __cxa_atexit(std::__cxx11::string::~string,
                   &sendBtnsState(fnode_service*,std::__cxx11::string_const&)::packet_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&sendBtnsState(fnode_service*,std::__cxx11::string_const&)::
                           packet_abi_cxx11_);
    }
  }
  std::__cxx11::string::clear();
  std::__cxx11::string::append
            ((char *)&sendBtnsState(fnode_service*,std::__cxx11::string_const&)::packet_abi_cxx11_);
  std::__cxx11::string::append
            ((string *)&sendBtnsState(fnode_service*,std::__cxx11::string_const&)::packet_abi_cxx11_
            );
  while( true ) {
    uVar2 = std::__cxx11::string::length();
    if (8 < uVar2) break;
    std::__cxx11::string::append
              ((char *)&sendBtnsState(fnode_service*,std::__cxx11::string_const&)::packet_abi_cxx11_
              );
  }
  if (in_RDI != 0) {
    std::__cxx11::string::c_str();
    std::__cxx11::string::length();
    fnode_service_notify_state(in_stack_00000410,in_stack_00000408,in_stack_00000404);
  }
  return;
}

Assistant:

void sendBtnsState(fnode_service_t * service, const string& btnsState)
{
    static string packet;
    packet.clear();
    packet.append("0");
    packet.append(btnsState);
    while(packet.length() < 9)
        packet.append("0");
    if(service)
        fnode_service_notify_state(service, packet.c_str(), packet.length());
}